

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O2

void * lzham::lzham_realloc
                 (lzham_malloc_context context,void *p,size_t size,size_t *pActual_size,bool movable
                 )

{
  uint uVar1;
  void *__dest;
  char *p_msg;
  char *context_00;
  size_t actual_size;
  
  p_msg = (char *)p;
  if (context == (lzham_malloc_context)0x0) {
    p_msg = 
    "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
    ;
    lzham_assert("context",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                 ,0x13c);
  }
  if (((ulong)p & 0xf) == 0) {
    if (size < 0x400000001) {
      actual_size = size;
      if (*context != 0x5749abcd) {
        lzham_assert("pContext->m_sig == malloc_context::cSig",
                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                     ,0x153);
      }
      if ((p < (void *)((long)context + 0x34U)) ||
         ((void *)((long)context + (ulong)*(uint *)((long)context + 4) + 0x34) <= p)) {
        if ((p != (void *)0x0) ||
           (__dest = malloc_context::arena_alloc((malloc_context *)context,size),
           __dest == (void *)0x0)) {
          __dest = (void *)(*(code *)g_pRealloc)(p,size,&actual_size,movable,g_pUser_data);
        }
      }
      else {
        if (!movable) {
          return (void *)0x0;
        }
        uVar1 = *(uint *)((long)p + -4);
        __dest = p;
        if (uVar1 < size) {
          __dest = malloc_context::arena_alloc((malloc_context *)context,size);
          if (__dest == (void *)0x0) {
            __dest = (void *)(*(code *)g_pRealloc)(0,size,&actual_size,1,g_pUser_data);
          }
          memcpy(__dest,p,(ulong)uVar1);
        }
      }
      if (pActual_size != (size_t *)0x0) {
        *pActual_size = actual_size;
        return __dest;
      }
      return __dest;
    }
    context_00 = "lzham_malloc: size too big";
  }
  else {
    context_00 = "lzham_realloc: bad ptr";
  }
  lzham_mem_error(context_00,p_msg);
  return (void *)0x0;
}

Assistant:

void* lzham_realloc(lzham_malloc_context context, void* p, size_t size, size_t* pActual_size, bool movable)
   {
      LZHAM_VERIFY(context);

      if ((ptr_bits_t)p & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error(context, "lzham_realloc: bad ptr");
         return NULL;
      }

      if (size > MAX_POSSIBLE_BLOCK_SIZE)
      {
         lzham_mem_error(context, "lzham_malloc: size too big");
         return NULL;
      }

#if LZHAM_MEM_STATS
      size_t cur_size = p ? (*g_pMSize)(p, g_pUser_data) : 0;
#endif

      size_t actual_size = size;
      void *p_new;
      
      malloc_context *pContext = static_cast<malloc_context *>(context);
      
      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      if (pContext->ptr_is_in_arena(p))
      {
         if (!movable)
            return NULL;
         
         uint prev_size = pContext->arena_msize(p);
         if (size <= prev_size)
         {
            p_new = p;
         }
         else
         {
            p_new = static_cast<uint8 *>(pContext->arena_alloc(size));
            if (!p_new)
            {
               p_new = (*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data);
            }
          
            memcpy(p_new, p, prev_size);
         }
      }
      else
      {
         p_new = NULL;

         if (!p)
            p_new = static_cast<uint8 *>(pContext->arena_alloc(size));
         
         if (!p_new)
            p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);
      }

      if (pActual_size)
         *pActual_size = actual_size;

      LZHAM_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if LZHAM_MEM_STATS
      int num_new_blocks = 0;
      if (p)
      {
         if (!p_new)
            num_new_blocks = -1;
      }
      else if (p_new)
      {
         num_new_blocks = 1;
      }
      pContext->update_total_allocated(num_new_blocks, static_cast<int64>(actual_size) - static_cast<int64>(cur_size));
#endif

      return p_new;
   }